

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Escape::CGraph::sortById(CGraph *this)

{
  long local_18;
  VertexIdx i;
  CGraph *this_local;
  
  for (local_18 = 0; local_18 < this->nVertices; local_18 = local_18 + 1) {
    std::sort<long*>(this->nbors + this->offsets[local_18],this->nbors + this->offsets[local_18 + 1]
                    );
  }
  return;
}

Assistant:

void CGraph::sortById() const {
    for (VertexIdx i = 0; i < nVertices; i++)
        std::sort(nbors + offsets[i], nbors + offsets[i + 1]);
}